

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

bool crn_decompress_dds_to_images
               (void *pDDS_file_data,crn_uint32 dds_file_size,crn_uint32 **ppImages,
               crn_texture_desc *tex_desc)

{
  bool bVar1;
  uint uVar2;
  pixel_format pVar3;
  mip_level *this;
  image_u8 *this_00;
  pixel_buf_t *this_01;
  void *pvVar4;
  uint *in_RCX;
  mipmapped_texture *in_RDX;
  image_u8 *pImg;
  mip_level *pLevel;
  uint32 l;
  uint32 f;
  bool uncook;
  data_stream_serializer in_serializer;
  buffer_stream in_stream;
  mipmapped_texture tex;
  mipmapped_texture *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  mipmapped_texture *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 uncook_00;
  mipmapped_texture *in_stack_fffffffffffffee8;
  mipmapped_texture *in_stack_fffffffffffffef0;
  uint local_d0;
  uint local_cc;
  data_stream_serializer local_c0 [2];
  data_stream local_a0;
  mipmapped_texture local_70;
  uint *local_28;
  mipmapped_texture *local_20;
  byte local_1;
  
  in_RCX[0] = 0;
  in_RCX[1] = 0;
  in_RCX[2] = 0;
  in_RCX[3] = 0;
  in_RCX[4] = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  crnlib::mipmapped_texture::mipmapped_texture(in_stack_fffffffffffffef0);
  crnlib::buffer_stream::buffer_stream
            ((buffer_stream *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  uncook_00 = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  crnlib::data_stream_serializer::data_stream_serializer(local_c0,&local_a0);
  bVar1 = crnlib::mipmapped_texture::read_dds
                    (in_stack_fffffffffffffed8,
                     (data_stream_serializer *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (bVar1) {
    bVar1 = crnlib::mipmapped_texture::is_packed(in_stack_fffffffffffffec8);
    if ((!bVar1) ||
       (bVar1 = crnlib::mipmapped_texture::unpack_from_dxt
                          (in_stack_fffffffffffffee8,(bool)uncook_00), bVar1)) {
      uVar2 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)0x1c387b);
      *local_28 = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_width(&local_70);
      local_28[1] = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_height(&local_70);
      local_28[2] = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_num_levels(in_stack_fffffffffffffec8);
      local_28[3] = uVar2;
      pVar3 = crnlib::mipmapped_texture::get_format(&local_70);
      local_28[4] = pVar3;
      for (local_cc = 0;
          uVar2 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)0x1c3934),
          local_cc < uVar2; local_cc = local_cc + 1) {
        for (local_d0 = 0;
            uVar2 = crnlib::mipmapped_texture::get_num_levels(in_stack_fffffffffffffec8),
            local_d0 < uVar2; local_d0 = local_d0 + 1) {
          this = crnlib::mipmapped_texture::get_level
                           ((mipmapped_texture *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                            (uint)in_stack_fffffffffffffec8);
          this_00 = crnlib::mip_level::get_image(this);
          this_01 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_pixel_buf(this_00);
          pvVar4 = crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::assume_ownership
                             (this_01);
          in_stack_fffffffffffffec8 = local_20;
          in_stack_fffffffffffffed0 = local_d0;
          in_stack_fffffffffffffed4 = crnlib::mipmapped_texture::get_num_levels(local_20);
          *(void **)(&(in_stack_fffffffffffffec8->m_name).m_buf_size +
                    (ulong)(in_stack_fffffffffffffed0 + in_stack_fffffffffffffed4 * local_cc) * 4) =
               pvVar4;
        }
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  crnlib::buffer_stream::~buffer_stream((buffer_stream *)0x1c3a64);
  crnlib::mipmapped_texture::~mipmapped_texture
            ((mipmapped_texture *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return (bool)(local_1 & 1);
}

Assistant:

bool crn_decompress_dds_to_images(const void* pDDS_file_data, crn_uint32 dds_file_size, crn_uint32** ppImages, crn_texture_desc& tex_desc) {
  memset(&tex_desc, 0, sizeof(tex_desc));

  mipmapped_texture tex;
  buffer_stream in_stream(pDDS_file_data, dds_file_size);
  data_stream_serializer in_serializer(in_stream);
  if (!tex.read_dds(in_serializer))
    return false;

  if (tex.is_packed()) {
    // TODO: Allow the user to disable uncooking of swizzled DXT5 formats?
    bool uncook = true;

    if (!tex.unpack_from_dxt(uncook))
      return false;
  }

  tex_desc.m_faces = tex.get_num_faces();
  tex_desc.m_width = tex.get_width();
  tex_desc.m_height = tex.get_height();
  tex_desc.m_levels = tex.get_num_levels();
  tex_desc.m_fmt_fourcc = (crn_uint32)tex.get_format();

  for (uint32 f = 0; f < tex.get_num_faces(); f++) {
    for (uint32 l = 0; l < tex.get_num_levels(); l++) {
      mip_level* pLevel = tex.get_level(f, l);
      image_u8* pImg = pLevel->get_image();
      ppImages[l + tex.get_num_levels() * f] = static_cast<crn_uint32*>(pImg->get_pixel_buf().assume_ownership());
    }
  }

  return true;
}